

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ImGuiContext *g;
  ImRect IVar11;
  
  pIVar4 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar5 = GImGui->NavWindow, pIVar5 == (ImGuiWindow *)0x0 || (pIVar5->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar7 = GImGui->HoveredRootWindow;
      if (pIVar7 == (ImGuiWindow *)0x0) {
        if ((pIVar5 != (ImGuiWindow *)0x0) &&
           (pIVar5 = GetTopMostPopupModal(), pIVar5 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else if ((pIVar7->Flags & 0x4000000) == 0) {
LAB_00119b2d:
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if (((pIVar4->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((pIVar7->Flags & 1) == 0))
        {
          IVar11 = ImGuiWindow::TitleBarRect(pIVar7);
          fVar1 = (pIVar4->IO).MouseClickedPos[0].x;
          if ((fVar1 < IVar11.Min.x) ||
             (((fVar2 = (pIVar4->IO).MouseClickedPos[0].y, fVar2 < IVar11.Min.y ||
               (IVar11.Max.x <= fVar1)) || (IVar11.Max.y <= fVar2)))) {
            pIVar4->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar4->HoveredIdDisabled == true) {
          pIVar4->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
      else {
        lVar8 = (long)(GImGui->OpenPopupStack).Size;
        if (0 < lVar8) {
          lVar9 = 0;
          do {
            if (*(ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar9) ==
                pIVar7->PopupId) goto LAB_00119b2d;
            lVar9 = lVar9 + 0x30;
          } while (lVar8 * 0x30 != lVar9);
        }
      }
    }
    if ((pIVar4->IO).MouseClicked[1] == true) {
      pIVar6 = GetTopMostPopupModal();
      pIVar5 = pIVar4->HoveredWindow;
      pIVar7 = pIVar6;
      if (pIVar5 != (ImGuiWindow *)0x0) {
        uVar10 = (ulong)(uint)(GImGui->Windows).Size;
        do {
          pIVar7 = pIVar6;
          if (((int)uVar10 < 1) ||
             (pIVar3 = (GImGui->Windows).Data[uVar10 - 1], pIVar7 = pIVar5, pIVar3 == pIVar5))
          break;
          uVar10 = uVar10 - 1;
          pIVar7 = pIVar6;
        } while (pIVar3 != pIVar6);
      }
      ClosePopupsOverWindow(pIVar7,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}